

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

SERecurrentNode * __thiscall
spvtools::opt::SENodeSimplifyImpl::UpdateCoefficient
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent,int64_t coefficient_update)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  int iVar3;
  SERecurrentNode *this_00;
  SENode *pSVar4;
  SENode *pSVar5;
  undefined4 extraout_var;
  pointer *__ptr;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_38;
  
  this_00 = (SERecurrentNode *)::operator_new(0x48);
  pSVar1 = (recurrent->super_SENode).parent_analysis_;
  pLVar2 = recurrent->loop_;
  (this_00->super_SENode).children_.
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_SENode).children_.
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_SENode).children_.
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_SENode).parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  (this_00->super_SENode).unique_id_ = SENode::NumberOfNodes;
  (this_00->super_SENode)._vptr_SENode = (_func_int **)&PTR_GetType_008b0cd8;
  this_00->loop_ = pLVar2;
  pSVar1 = this->analysis_;
  pSVar5 = recurrent->coefficient_;
  pSVar4 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,coefficient_update);
  pSVar4 = ScalarEvolutionAnalysis::CreateMultiplyNode(pSVar1,pSVar5,pSVar4);
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,pSVar4);
  iVar3 = (**pSVar5->_vptr_SENode)(pSVar5);
  if (iVar3 == 6) {
    pSVar5 = pSVar4;
  }
  if (coefficient_update < 0) {
    pSVar4 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,recurrent->offset_);
  }
  else {
    pSVar4 = recurrent->offset_;
  }
  SERecurrentNode::AddOffset(this_00,pSVar4);
  SERecurrentNode::AddCoefficient(this_00,pSVar5);
  local_38._M_head_impl = (SENode *)this_00;
  pSVar5 = ScalarEvolutionAnalysis::GetCachedOrAdd
                     (this->analysis_,
                      (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                       *)&local_38);
  iVar3 = (*pSVar5->_vptr_SENode[6])(pSVar5);
  if ((SERecurrentNode *)local_38._M_head_impl != (SERecurrentNode *)0x0) {
    (*((SENode *)&(local_38._M_head_impl)->_vptr_SENode)->_vptr_SENode[2])();
  }
  return (SERecurrentNode *)CONCAT44(extraout_var,iVar3);
}

Assistant:

SERecurrentNode* SENodeSimplifyImpl::UpdateCoefficient(
    SERecurrentNode* recurrent, int64_t coefficient_update) const {
  std::unique_ptr<SERecurrentNode> new_recurrent_node{new SERecurrentNode(
      recurrent->GetParentAnalysis(), recurrent->GetLoop())};

  SENode* new_coefficient = analysis_.CreateMultiplyNode(
      recurrent->GetCoefficient(),
      analysis_.CreateConstant(coefficient_update));

  // See if the node can be simplified.
  SENode* simplified = analysis_.SimplifyExpression(new_coefficient);
  if (simplified->GetType() != SENode::CanNotCompute)
    new_coefficient = simplified;

  if (coefficient_update < 0) {
    new_recurrent_node->AddOffset(
        analysis_.CreateNegation(recurrent->GetOffset()));
  } else {
    new_recurrent_node->AddOffset(recurrent->GetOffset());
  }

  new_recurrent_node->AddCoefficient(new_coefficient);

  return analysis_.GetCachedOrAdd(std::move(new_recurrent_node))
      ->AsSERecurrentNode();
}